

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall FTOutline::moveTo(FTOutline *this,VPointF *pt)

{
  SW_FT_Pos SVar1;
  VPointF *in_RSI;
  FTOutline *in_RDI;
  float fVar2;
  
  fVar2 = VPointF::x(in_RSI);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].x = SVar1;
  fVar2 = VPointF::y(in_RSI);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].y = SVar1;
  (in_RDI->ft).tags[(in_RDI->ft).n_points] = '\x01';
  if ((in_RDI->ft).n_points != 0) {
    (in_RDI->ft).contours[(in_RDI->ft).n_contours] = (in_RDI->ft).n_points + -1;
    (in_RDI->ft).n_contours = (in_RDI->ft).n_contours + 1;
  }
  (in_RDI->ft).contours_flag[(in_RDI->ft).n_contours] = '\x01';
  (in_RDI->ft).n_points = (in_RDI->ft).n_points + 1;
  return;
}

Assistant:

void FTOutline::moveTo(const VPointF &pt)
{
    assert(ft.n_points <= SHRT_MAX - 1);

    ft.points[ft.n_points].x = TO_FT_COORD(pt.x());
    ft.points[ft.n_points].y = TO_FT_COORD(pt.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_ON;
    if (ft.n_points) {
        ft.contours[ft.n_contours] = ft.n_points - 1;
        ft.n_contours++;
    }
    // mark the current contour as open
    // will be updated if ther is a close tag at the end.
    ft.contours_flag[ft.n_contours] = 1;

    ft.n_points++;
}